

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

char * __thiscall CommandLineArguments::help(CommandLineArguments *this)

{
  return 
  "Thanks for using CppUTest.\n\nOptions that do not run tests but query:\n  -h                 - this wonderful help screen. Joy!\n  -lg                - print a list of group names, separated by spaces\n  -ln                - print a list of test names in the form of group.name, separated by spaces\n\nOptions that change the output format:\n  -c                - colorize output, print green if OK, or red if failed\n  -v                - verbose, print each test name as it runs\n  -vv               - very verbose, print internal information during test run\n\nOptions that change the output location:\n  -oteamcity       - output to xml files (as the name suggests, for TeamCity)\n  -ojunit          - output to JUnit ant plugin style xml files (for CI systems)\n  -k package name  - Add a package name in JUnit output (for classification in CI systems)\n\n\nOptions that control which tests are run:\n  -g group         - only run test whose group contains the substring group\n  -n name          - only run test whose name contains the substring name\n  -t group.name    - only run test whose name contains the substring group and name\n  -sg group        - only run test whose group exactly matches the string group\n  -sn name         - only run test whose name exactly matches the string name\n  -xg group        - exclude tests whose group contains the substring group (v3.8)\n  -xn name         - exclude tests whose name contains the substring name (v3.8)\n  TEST(group,name) - only run test whose group and name matches the strings group and name.\n                     This can be used to copy-paste output from the -v option on the command line.\n\nOptions that control how the tests are run:\n  -p               - run tests in a separate process.\n  -b               - run the tests backwards, reversing the normal way\n  -s [seed]        - shuffle tests randomly. Seed is optional\n  -r#              - repeat the tests some number (#) of times, or twice if # is not specified.\n"
  ;
}

Assistant:

const char* CommandLineArguments::help() const
{
    return
      "Thanks for using CppUTest.\n"
      "\n"
      "Options that do not run tests but query:\n"
      "  -h                 - this wonderful help screen. Joy!\n"
      "  -lg                - print a list of group names, separated by spaces\n"
      "  -ln                - print a list of test names in the form of group.name, separated by spaces\n"
      "\n"
      "Options that change the output format:\n"
      "  -c                - colorize output, print green if OK, or red if failed\n"
      "  -v                - verbose, print each test name as it runs\n"
      "  -vv               - very verbose, print internal information during test run\n"
      "\n"
      "Options that change the output location:\n"
      "  -oteamcity       - output to xml files (as the name suggests, for TeamCity)\n"
      "  -ojunit          - output to JUnit ant plugin style xml files (for CI systems)\n"
      "  -k package name  - Add a package name in JUnit output (for classification in CI systems)\n"
      "\n"
      "\n"
      "Options that control which tests are run:\n"
      "  -g group         - only run test whose group contains the substring group\n"
      "  -n name          - only run test whose name contains the substring name\n"
      "  -t group.name    - only run test whose name contains the substring group and name\n"
      "  -sg group        - only run test whose group exactly matches the string group\n"
      "  -sn name         - only run test whose name exactly matches the string name\n"
      "  -xg group        - exclude tests whose group contains the substring group (v3.8)\n"
      "  -xn name         - exclude tests whose name contains the substring name (v3.8)\n"
      "  TEST(group,name) - only run test whose group and name matches the strings group and name.\n"
      "                     This can be used to copy-paste output from the -v option on the command line.\n"
      "\n"
      "Options that control how the tests are run:\n"
      "  -p               - run tests in a separate process.\n"
      "  -b               - run the tests backwards, reversing the normal way\n"
      "  -s [seed]        - shuffle tests randomly. Seed is optional\n"
      "  -r#              - repeat the tests some number (#) of times, or twice if # is not specified.\n";
}